

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O2

string * __thiscall libDAI::TRW::identify_abi_cxx11_(string *__return_storage_ptr__,TRW *this)

{
  ostream *os;
  stringstream result;
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&result,_S_out);
  os = std::operator<<(local_188,Name);
  libDAI::operator<<(os,&(this->super_DAIAlgFG).super_InferenceAlgorithm._properties);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&result);
  return __return_storage_ptr__;
}

Assistant:

string TRW::identify() const { 
        stringstream result (stringstream::out);
        result << Name << GetProperties();
        return result.str();
    }